

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGhsMultiGenerator.cxx
# Opt level: O0

bool __thiscall
cmGlobalGhsMultiGenerator::SetGeneratorToolset
          (cmGlobalGhsMultiGenerator *this,string *ts,cmMakefile *mf)

{
  undefined8 uVar1;
  bool bVar2;
  ulong uVar3;
  char *pcVar4;
  char *__rhs;
  allocator<char> local_181;
  string local_180;
  allocator<char> local_159;
  string local_158;
  allocator<char> local_131;
  undefined1 local_130 [8];
  string message_1;
  string local_108;
  char *local_e8;
  char *prevTool;
  undefined1 local_c0 [8];
  string gbuild;
  string local_98;
  undefined1 local_78 [8];
  string message;
  undefined1 local_48 [8];
  string tsp;
  cmMakefile *mf_local;
  string *ts_local;
  cmGlobalGhsMultiGenerator *this_local;
  
  tsp.field_2._8_8_ = mf;
  std::__cxx11::string::string((string *)local_48);
  GetToolset(this,(cmMakefile *)tsp.field_2._8_8_,(string *)local_48,ts);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) != 0) {
      std::__cxx11::string::string((string *)local_78);
      std::__cxx11::string::operator=
                ((string *)local_78,
                 "Green Hills MULTI: -T <toolset> not specified; defaulting to \"");
      std::__cxx11::string::operator+=((string *)local_78,(string *)local_48);
      std::__cxx11::string::operator+=((string *)local_78,"\"");
      cmSystemTools::Message((string *)local_78,(char *)0x0);
      uVar1 = tsp.field_2._8_8_;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_98,"CMAKE_GENERATOR_TOOLSET",
                 (allocator<char> *)(gbuild.field_2._M_local_buf + 0xf));
      pcVar4 = (char *)std::__cxx11::string::c_str();
      cmMakefile::AddCacheDefinition
                ((cmMakefile *)uVar1,&local_98,pcVar4,"Location of generator toolset.",INTERNAL,
                 false);
      std::__cxx11::string::~string((string *)&local_98);
      std::allocator<char>::~allocator((allocator<char> *)(gbuild.field_2._M_local_buf + 0xf));
      std::__cxx11::string::~string((string *)local_78);
    }
    pcVar4 = (char *)std::__cxx11::string::back();
    __rhs = "/";
    if (*pcVar4 == '/') {
      __rhs = "";
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&prevTool,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
                   __rhs);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&prevTool,
                   DEFAULT_BUILD_PROGRAM);
    std::__cxx11::string::~string((string *)&prevTool);
    uVar1 = tsp.field_2._8_8_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_108,"CMAKE_MAKE_PROGRAM",
               (allocator<char> *)(message_1.field_2._M_local_buf + 0xf));
    pcVar4 = cmMakefile::GetDefinition((cmMakefile *)uVar1,&local_108);
    std::__cxx11::string::~string((string *)&local_108);
    std::allocator<char>::~allocator((allocator<char> *)(message_1.field_2._M_local_buf + 0xf));
    local_e8 = pcVar4;
    if ((pcVar4 == (char *)0x0) ||
       (bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_c0,pcVar4), !bVar2)) {
      uVar1 = tsp.field_2._8_8_;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_158,"CMAKE_MAKE_PROGRAM",&local_159);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      cmMakefile::AddCacheDefinition
                ((cmMakefile *)uVar1,&local_158,pcVar4,"build program to use",INTERNAL,true);
      std::__cxx11::string::~string((string *)&local_158);
      std::allocator<char>::~allocator(&local_159);
      uVar1 = tsp.field_2._8_8_;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_180,"CMAKE_SYSTEM_VERSION",&local_181);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      cmMakefile::AddDefinition((cmMakefile *)uVar1,&local_180,pcVar4);
      std::__cxx11::string::~string((string *)&local_180);
      std::allocator<char>::~allocator(&local_181);
      this_local._7_1_ = true;
      message.field_2._8_4_ = 1;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_130,"toolset build tool: ",&local_131);
      std::allocator<char>::~allocator(&local_131);
      std::__cxx11::string::operator+=((string *)local_130,(string *)local_c0);
      std::__cxx11::string::operator+=
                ((string *)local_130,"\nDoes not match the previously used build tool: ");
      std::__cxx11::string::operator+=((string *)local_130,local_e8);
      std::__cxx11::string::operator+=
                ((string *)local_130,
                 "\nEither remove the CMakeCache.txt file and CMakeFiles directory or choose a different binary directory."
                );
      cmSystemTools::Error((string *)local_130);
      this_local._7_1_ = false;
      message.field_2._8_4_ = 1;
      std::__cxx11::string::~string((string *)local_130);
    }
    std::__cxx11::string::~string((string *)local_c0);
  }
  else {
    this_local._7_1_ = false;
    message.field_2._8_4_ = 1;
  }
  std::__cxx11::string::~string((string *)local_48);
  return this_local._7_1_;
}

Assistant:

bool cmGlobalGhsMultiGenerator::SetGeneratorToolset(std::string const& ts,
                                                    cmMakefile* mf)
{
  std::string tsp; /* toolset path */

  this->GetToolset(mf, tsp, ts);

  /* no toolset was found */
  if (tsp.empty()) {
    return false;
  }
  if (ts.empty()) {
    std::string message;
    message =
      "Green Hills MULTI: -T <toolset> not specified; defaulting to \"";
    message += tsp;
    message += "\"";
    cmSystemTools::Message(message);

    /* store the full toolset for later use
     * -- already done if -T<toolset> was specified
     */
    mf->AddCacheDefinition("CMAKE_GENERATOR_TOOLSET", tsp.c_str(),
                           "Location of generator toolset.",
                           cmStateEnums::INTERNAL);
  }

  /* set the build tool to use */
  std::string gbuild(tsp + ((tsp.back() == '/') ? "" : "/") +
                     DEFAULT_BUILD_PROGRAM);
  const char* prevTool = mf->GetDefinition("CMAKE_MAKE_PROGRAM");

  /* check if the toolset changed from last generate */
  if (prevTool != nullptr && (gbuild != prevTool)) {
    std::string message = "toolset build tool: ";
    message += gbuild;
    message += "\nDoes not match the previously used build tool: ";
    message += prevTool;
    message += "\nEither remove the CMakeCache.txt file and CMakeFiles "
               "directory or choose a different binary directory.";
    cmSystemTools::Error(message);
    return false;
  }

  /* store the toolset that is being used for this build */
  mf->AddCacheDefinition("CMAKE_MAKE_PROGRAM", gbuild.c_str(),
                         "build program to use", cmStateEnums::INTERNAL, true);

  mf->AddDefinition("CMAKE_SYSTEM_VERSION", tsp.c_str());

  return true;
}